

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlacon2.c
# Opt level: O1

int zlacon2_(int *n,doublecomplex *v,doublecomplex *x,double *est,int *kase,int *isave)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  doublecomplex *pdVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  int c__1;
  int local_44;
  double local_40;
  double local_38;
  
  local_44 = 1;
  local_40 = dmach("Safe minimum");
  if (*kase == 0) {
    iVar2 = *n;
    if (0 < (long)iVar2) {
      lVar6 = 0;
      do {
        *(double *)((long)&x->r + lVar6) = 1.0 / (double)iVar2;
        *(undefined8 *)((long)&x->i + lVar6) = 0;
        lVar6 = lVar6 + 0x10;
      } while ((long)iVar2 * 0x10 != lVar6);
    }
    iVar2 = 1;
LAB_0011a291:
    *kase = iVar2;
    *isave = iVar2;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar2 = izmax1_slu(n,x,&local_44);
    isave[1] = iVar2 + -1;
    isave[2] = 2;
    goto LAB_0011a2f6;
  case 3:
    zcopy_(n,x,&local_44,v,&local_44);
    local_38 = *est;
    dVar10 = dzsum1_slu(n,v,&local_44);
    *est = dVar10;
    if (local_38 < dVar10) {
      if (0 < *n) {
        lVar6 = 0;
        do {
          dVar10 = z_abs(x);
          if (dVar10 <= local_40) {
            x->r = 1.0;
            x->i = 0.0;
          }
          else {
            x->r = x->r * (1.0 / dVar10);
            x->i = (1.0 / dVar10) * x->i;
          }
          lVar6 = lVar6 + 1;
          x = x + 1;
        } while (lVar6 < *n);
      }
      *kase = 2;
      *isave = 4;
      return 0;
    }
LAB_0011a44d:
    uVar1 = *n;
    if (0 < (int)uVar1) {
      pdVar7 = &x->i;
      uVar5 = 0;
      dVar10 = 1.0;
      do {
        ((doublecomplex *)(pdVar7 + -1))->r =
             ((double)(int)uVar5 / (double)(int)(uVar1 - 1) + 1.0) * dVar10;
        *pdVar7 = 0.0;
        dVar10 = -dVar10;
        uVar5 = uVar5 + 1;
        pdVar7 = pdVar7 + 2;
      } while (uVar1 != uVar5);
    }
    *kase = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar2 = isave[1];
    iVar3 = izmax1_slu(n,x,&local_44);
    isave[1] = iVar3 + -1;
    if (((x[iVar2].r == ABS(x[(long)iVar3 + -1].r)) &&
        (!NAN(x[iVar2].r) && !NAN(ABS(x[(long)iVar3 + -1].r)))) || (4 < isave[2]))
    goto LAB_0011a44d;
    isave[2] = isave[2] + 1;
LAB_0011a2f6:
    if (0 < *n) {
      lVar6 = 0;
      pdVar4 = x;
      do {
        pdVar4->r = 0.0;
        pdVar4->i = 0.0;
        lVar6 = lVar6 + 1;
        pdVar4 = pdVar4 + 1;
      } while (lVar6 < *n);
    }
    iVar2 = isave[1];
    x[iVar2].r = 1.0;
    x[iVar2].i = 0.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 5:
    local_40 = dzsum1_slu(n,x,&local_44);
    local_40 = local_40 / (double)(*n * 3);
    local_40 = local_40 + local_40;
    if (local_40 < *est || local_40 == *est) goto LAB_0011a4d7;
    zcopy_(n,x,&local_44,v,&local_44);
    uVar8 = SUB84(local_40,0);
    uVar9 = (undefined4)((ulong)local_40 >> 0x20);
    break;
  default:
    if (*n != 1) {
      dVar10 = dzsum1_slu(n,x,&local_44);
      *est = dVar10;
      if (0 < *n) {
        lVar6 = 0;
        do {
          dVar10 = z_abs(x);
          if (dVar10 <= local_40) {
            x->r = 1.0;
            x->i = 0.0;
          }
          else {
            x->r = x->r * (1.0 / dVar10);
            x->i = (1.0 / dVar10) * x->i;
          }
          lVar6 = lVar6 + 1;
          x = x + 1;
        } while (lVar6 < *n);
      }
      iVar2 = 2;
      goto LAB_0011a291;
    }
    dVar10 = x->i;
    v->r = x->r;
    v->i = dVar10;
    dVar10 = z_abs(v);
    uVar8 = SUB84(dVar10,0);
    uVar9 = (undefined4)((ulong)dVar10 >> 0x20);
  }
  *est = (double)CONCAT44(uVar9,uVar8);
LAB_0011a4d7:
  *kase = 0;
  return 0;
}

Assistant:

int
zlacon2_(int *n, doublecomplex *v, doublecomplex *x, double *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};

    /* System generated locals */
    double d__1;
    
    /* Local variables */
    int jlast;
    double altsgn, estold;
    int i;
    double temp;
    double safmin;
    extern double dmach(char *);
    extern int izmax1_slu(int *, doublecomplex *, int *);
    extern double dzsum1_slu(int *, doublecomplex *, int *);
    extern void zcopy_(int *, doublecomplex *, int *, doublecomplex *, int *);

    safmin = dmach("Safe minimum");
    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i].r = 1. / (double) (*n);
	    x[i].i = 0.;
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = z_abs(&v[0]);
	/*        ... QUIT */
	goto L150;
    }
    *est = dzsum1_slu(n, x, &c__1);

    for (i = 0; i < *n; ++i) {
	d__1 = z_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
    isave[1] = izmax1_slu(n, &x[0], &c__1);  /* j */
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    CCOPY(n, x, &c__1, v, &c__1);
#else
    zcopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
    *est = dzsum1_slu(n, v, &c__1);


L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	d__1 = z_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
    isave[1] = izmax1_slu(n, &x[0], &c__1); /* j */
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast].r != (d__1 = x[isave[1]].r, fabs(d__1)) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1].r = altsgn * ((double)(i - 1) / (double)(*n - 1) + 1.);
	x[i-1].i = 0.;
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
    temp = dzsum1_slu(n, x, &c__1) / (double)(*n * 3) * 2.;
    if (temp > *est) {
#ifdef _CRAY
	CCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	zcopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}